

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall GLDrawList::SortSpriteIntoPlane(GLDrawList *this,SortNode *head,SortNode *sort)

{
  float fVar1;
  int iVar2;
  int iVar3;
  GLDrawItem *pGVar4;
  GLFlat *pGVar5;
  GLSprite *pGVar6;
  double dVar7;
  GLSprite *pGVar8;
  SortNode *child;
  GLSprite *pGVar9;
  float fVar10;
  double dVar11;
  GLSprite s;
  GLSprite local_d0;
  
  dVar7 = ViewPos.Z;
  pGVar4 = (this->drawitems).Array;
  iVar2 = pGVar4[head->itemindex].index;
  iVar3 = pGVar4[sort->itemindex].index;
  pGVar5 = (this->flats).Array;
  pGVar6 = (this->sprites).Array;
  fVar1 = pGVar5[iVar2].z;
  dVar11 = (double)fVar1;
  if ((pGVar6[iVar3].z2 < fVar1 && fVar1 < pGVar6[iVar3].z1) ||
     (pGVar6[iVar3].modelframe != (FSpriteModelFrame *)0x0)) {
    memcpy(&local_d0,pGVar6 + iVar3,0xa0);
    AddSprite(this,&local_d0);
    if (((byte)gl.flags & 0x20) != 0) {
      pGVar6 = (this->sprites).Array;
      pGVar8 = pGVar6 + ((this->sprites).Count - 1);
      iVar3 = (this->drawitems).Array[sort->itemindex].index;
      fVar1 = pGVar5[iVar2].z;
      fVar10 = ((fVar1 - pGVar6[iVar3].z1) * (pGVar6[iVar3].vb - pGVar6[iVar3].vt)) /
               (pGVar6[iVar3].z2 - pGVar6[iVar3].z1) + pGVar6[iVar3].vt;
      if (dVar11 <= dVar7) {
        pGVar9 = pGVar6 + iVar3;
        pGVar8->z2 = fVar1;
        pGVar6[iVar3].z1 = fVar1;
        pGVar8->vb = fVar10;
      }
      else {
        pGVar6[iVar3].z2 = fVar1;
        pGVar8->z1 = fVar1;
        pGVar6[iVar3].vb = fVar10;
        pGVar9 = pGVar8;
      }
      pGVar9->vt = fVar10;
    }
    child = StaticSortNodeArray::GetNew(&SortNodes);
    *(undefined8 *)child = 0;
    child->parent = (SortNode *)0x0;
    child->next = (SortNode *)0x0;
    child->left = (SortNode *)0x0;
    child->equal = (SortNode *)0x0;
    child->right = (SortNode *)0x0;
    child->itemindex = (this->drawitems).Count - 1;
    SortNode::AddToLeft(head,sort);
    SortNode::AddToRight(head,child);
    return;
  }
  if ((fVar1 <= pGVar6[iVar3].z2 || ViewPos.Z < dVar11) &&
     (pGVar6[iVar3].z1 <= fVar1 || ViewPos.Z >= dVar11)) {
    SortNode::AddToRight(head,sort);
    return;
  }
  SortNode::AddToLeft(head,sort);
  return;
}

Assistant:

void GLDrawList::SortSpriteIntoPlane(SortNode * head,SortNode * sort)
{
	GLFlat * fh=&flats[drawitems[head->itemindex].index];
	GLSprite * ss=&sprites[drawitems[sort->itemindex].index];

	bool ceiling = fh->z > ViewPos.Z;

	if ((ss->z1>fh->z && ss->z2<fh->z) || ss->modelframe)
	{
		// We have to split this sprite
		GLSprite s=*ss;
		AddSprite(&s);	// add a copy to avoid reallocation issues.
	
		// Splitting is done in the shader with clip planes, if available
		if (gl.flags & RFL_NO_CLIP_PLANES)
		{
			GLSprite * ss1;
			ss1=&sprites[sprites.Size()-1];
			ss=&sprites[drawitems[sort->itemindex].index];	// may have been reallocated!
			float newtexv=ss->vt + ((ss->vb-ss->vt)/(ss->z2-ss->z1))*(fh->z-ss->z1);

			if (!ceiling)
			{
				ss->z1=ss1->z2=fh->z;
				ss->vt=ss1->vb=newtexv;
			}
			else
			{
				ss1->z1=ss->z2=fh->z;
				ss1->vt=ss->vb=newtexv;
			}
		}

		SortNode * sort2=SortNodes.GetNew();
		memset(sort2,0,sizeof(SortNode));
		sort2->itemindex=drawitems.Size()-1;

		head->AddToLeft(sort);
		head->AddToRight(sort2);
	}
	else if ((ss->z2<fh->z && !ceiling) || (ss->z1>fh->z && ceiling))	// completely on the left side
	{
		head->AddToLeft(sort);
	}
	else
	{
		head->AddToRight(sort);
	}

}